

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CheckExtensionDeclaration
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto,
          string_view declared_full_name,string_view declared_type_name,bool is_repeated)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  FieldDescriptorProto *pFVar1;
  bool bVar2;
  bool bVar3;
  DescriptorBuilder *b;
  anon_class_16_2_94fa245e local_170;
  VoidPtr local_160;
  Invoker<std::__cxx11::basic_string<char>_> local_158;
  string_view local_150;
  anon_class_24_3_0e03a617 local_140;
  VoidPtr local_128;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_120;
  string_view local_108;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_f8;
  DescriptorBuilder *local_e8;
  char *local_e0;
  string_view local_d8;
  AlphaNum local_c8;
  AlphaNum local_98;
  undefined1 local_68 [8];
  string actual_full_name;
  bool local_31;
  FieldDescriptorProto *pFStack_30;
  bool is_repeated_local;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  string_view declared_full_name_local;
  
  declared_full_name_local._M_len = (size_t)declared_full_name._M_str;
  this_local = (DescriptorBuilder *)declared_full_name._M_len;
  b = this;
  local_31 = is_repeated;
  pFStack_30 = proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&declared_type_name);
  if (!bVar2) {
    actual_full_name.field_2._8_8_ = declared_type_name._M_len;
    b = (DescriptorBuilder *)declared_type_name._M_len;
    CheckExtensionDeclarationFieldType
              (this,(FieldDescriptor *)proto_local,pFStack_30,declared_type_name);
  }
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (!bVar2) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_98,".");
    local_d8 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_c8,local_d8);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_68,(lts_20250127 *)&local_98,&local_c8,(AlphaNum *)b);
    local_e8 = this_local;
    local_e0 = (char *)declared_full_name_local._M_len;
    local_f8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    __x._M_str = local_e0;
    __x._M_len = (size_t)local_e8;
    bVar2 = std::operator!=(__x,local_f8);
    if (bVar2) {
      local_108 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
      pFVar1 = pFStack_30;
      local_140.field = (FieldDescriptor *)proto_local;
      local_140.declared_full_name = (string_view *)&this_local;
      local_140.actual_full_name = (string *)local_68;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_128,&local_140);
      make_error.invoker_ = p_Stack_120;
      make_error.ptr_.obj = local_128.obj;
      AddError(this,local_108,&pFVar1->super_Message,EXTENDEE,make_error);
    }
    std::__cxx11::string::~string((string *)local_68);
  }
  bVar2 = (bool)(local_31 & 1);
  bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)proto_local);
  if (bVar2 != bVar3) {
    local_150 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    pFVar1 = pFStack_30;
    local_170.field = (FieldDescriptor *)proto_local;
    local_170.is_repeated = &local_31;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__1,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_160,&local_170);
    make_error_00.invoker_ = local_158;
    make_error_00.ptr_.obj = local_160.obj;
    AddError(this,local_150,&pFVar1->super_Message,EXTENDEE,make_error_00);
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckExtensionDeclaration(
    const FieldDescriptor& field, const FieldDescriptorProto& proto,
    absl::string_view declared_full_name, absl::string_view declared_type_name,
    bool is_repeated) {
  if (!declared_type_name.empty()) {
    CheckExtensionDeclarationFieldType(field, proto, declared_type_name);
  }
  if (!declared_full_name.empty()) {
    std::string actual_full_name = absl::StrCat(".", field.full_name());
    if (declared_full_name != actual_full_name) {
      AddError(field.full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                 return absl::Substitute(
                     "\"$0\" extension field $1 is expected to have field name "
                     "\"$2\", not \"$3\".",
                     field.containing_type()->full_name(), field.number(),
                     declared_full_name, actual_full_name);
               });
    }
  }

  if (is_repeated != field.is_repeated()) {
    AddError(field.full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
             [&] {
               return absl::Substitute(
                   "\"$0\" extension field $1 is expected to be $2.",
                   field.containing_type()->full_name(), field.number(),
                   is_repeated ? "repeated" : "optional");
             });
  }
}